

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O3

void __thiscall
duckdb::RangeInfoStruct<duckdb::NumericRangeInfo,_true>::GetListValues
          (RangeInfoStruct<duckdb::NumericRangeInfo,_true> *this,idx_t row_idx,TYPE *start_value,
          TYPE *end_value,INCREMENT_TYPE *increment_value)

{
  sel_t *psVar1;
  long lVar2;
  INCREMENT_TYPE IVar3;
  TYPE TVar4;
  idx_t iVar5;
  
  lVar2 = (long)(this->args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar2 == 0x68) {
    TVar4 = 0;
  }
  else {
    psVar1 = (this->vdata[0].sel)->sel_vector;
    iVar5 = row_idx;
    if (psVar1 != (sel_t *)0x0) {
      iVar5 = (idx_t)psVar1[row_idx];
    }
    TVar4 = *(TYPE *)(this->vdata[0].data + iVar5 * 8);
  }
  *start_value = TVar4;
  psVar1 = (this->vdata[lVar2 != 0x68].sel)->sel_vector;
  iVar5 = row_idx;
  if (psVar1 != (sel_t *)0x0) {
    iVar5 = (idx_t)psVar1[row_idx];
  }
  *end_value = *(TYPE *)(this->vdata[lVar2 != 0x68].data + iVar5 * 8);
  IVar3 = 1;
  if (2 < (ulong)((lVar2 >> 3) * 0x4ec4ec4ec4ec4ec5)) {
    psVar1 = (this->vdata[2].sel)->sel_vector;
    if (psVar1 != (sel_t *)0x0) {
      row_idx = (idx_t)psVar1[row_idx];
    }
    IVar3 = *(INCREMENT_TYPE *)(this->vdata[2].data + row_idx * 8);
  }
  *increment_value = IVar3;
  return;
}

Assistant:

typename OP::TYPE StartListValue(idx_t row_idx) {
		if (args.ColumnCount() == 1) {
			return OP::DefaultStart();
		} else {
			auto data = (typename OP::TYPE *)vdata[0].data;
			auto idx = vdata[0].sel->get_index(row_idx);
			return data[idx];
		}
	}